

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_tools.h
# Opt level: O2

void math::matrix_transpose_multiply<double>(double *mat_a,int rows,int cols,double *mat_res)

{
  int iVar1;
  double *pdVar2;
  int iVar3;
  long lVar4;
  double *pdVar5;
  int c1;
  int iVar6;
  
  for (lVar4 = 0; (ulong)(uint)(cols * cols) << 3 != lVar4; lVar4 = lVar4 + 8) {
    *(undefined8 *)((long)mat_res + lVar4) = 0;
  }
  iVar1 = 0;
  iVar3 = 0;
  if (0 < cols) {
    iVar3 = cols;
  }
  if (rows < 1) {
    rows = 0;
  }
  pdVar5 = mat_a;
  for (; iVar1 != rows; iVar1 = iVar1 + 1) {
    pdVar2 = mat_res;
    for (iVar6 = 0; iVar6 != iVar3; iVar6 = iVar6 + 1) {
      for (lVar4 = 0; (ulong)(uint)cols << 3 != lVar4; lVar4 = lVar4 + 8) {
        *(double *)((long)pdVar2 + lVar4) =
             *(double *)((long)mat_a + lVar4) * *pdVar5 + *(double *)((long)pdVar2 + lVar4);
      }
      pdVar5 = pdVar5 + 1;
      pdVar2 = (double *)((long)pdVar2 + lVar4);
    }
    mat_a = mat_a + cols;
  }
  return;
}

Assistant:

void
matrix_transpose_multiply (T const* mat_a, int rows, int cols, T* mat_res)
{
    std::fill(mat_res, mat_res + cols * cols, T(0));

    T const* A_trans_iter = mat_a;
    T const* A_row = mat_a;
    for (int ri = 0; ri < rows; ++ri, A_row += cols)
    {
        T* R_iter = mat_res;
        for (int c1 = 0; c1 < cols; ++c1, ++A_trans_iter)
            for (int c2 = 0; c2 < cols; ++c2, ++R_iter)
                (*R_iter) += A_row[c2] * (*A_trans_iter);
    }
}